

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf-test.cpp
# Opt level: O1

void us16_to_us32_test(int line,UTF_US16 *str1,UTF_US32 *str2,bool ok)

{
  pointer pcVar1;
  char16_t cVar2;
  int iVar3;
  char32_t *pcVar4;
  char16_t cVar5;
  uint uVar6;
  pointer pcVar7;
  long lVar8;
  char32_t cVar9;
  ulong in_R9;
  char32_t cVar10;
  char32_t unaff_R13D;
  bool bVar11;
  bool bVar12;
  UTF_US32 tmp;
  UTF_UC32 buf [256];
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_460;
  UTF_US32 *local_440;
  char32_t local_438 [258];
  
  local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
  local_460._M_string_length = 0;
  local_460.field_2._M_local_buf[0] = L'\0';
  local_440 = str2;
  if (str1->_M_string_length != 0) {
    pcVar7 = (str1->_M_dataplus)._M_p;
    pcVar1 = pcVar7 + str1->_M_string_length;
    do {
      cVar2 = *pcVar7;
      uVar6 = (ushort)cVar2 & 0xfc00;
      if (uVar6 == 0xd800) {
        pcVar7 = pcVar7 + 1;
        if (pcVar7 == pcVar1) {
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::push_back
                    (&local_460,L'?');
          break;
        }
        cVar5 = *pcVar7;
      }
      else {
        cVar5 = L'\0';
      }
      if (uVar6 == 0xdc00) {
LAB_00101e70:
        bVar12 = cVar5 == L'\0';
        if (bVar12) {
          unaff_R13D = (uint)(ushort)cVar2;
        }
      }
      else if (uVar6 == 0xd800) {
        if ((cVar5 & 0xfc00U) != 0xdc00) goto LAB_00101e70;
        bVar12 = true;
        unaff_R13D = (uint)(ushort)cVar2 * 0x400 + (uint)(ushort)cVar5 + L'\xfca02400';
      }
      else {
        bVar12 = true;
        unaff_R13D = (uint)(ushort)cVar2;
      }
      if (!bVar12) {
        unaff_R13D = L'?';
      }
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      push_back(&local_460,unaff_R13D);
      pcVar7 = pcVar7 + 1;
    } while (pcVar7 != pcVar1);
  }
  UTF_test(line,ok);
  iVar3 = std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::compare
                    (&local_460,local_440);
  UTF_test(line,iVar3 == 0);
  bVar12 = true;
  if (str1->_M_string_length == 0) {
    pcVar4 = local_438;
  }
  else {
    pcVar7 = (str1->_M_dataplus)._M_p;
    pcVar1 = pcVar7 + str1->_M_string_length;
    lVar8 = 0x3fc;
    pcVar4 = local_438;
    do {
      cVar2 = *pcVar7;
      cVar10 = (char32_t)(ushort)cVar2;
      uVar6 = cVar10 & 0xfc00;
      if (uVar6 == 0xd800) {
        pcVar7 = pcVar7 + 1;
        if (pcVar7 != pcVar1) {
          cVar5 = *pcVar7;
          goto LAB_00101f2d;
        }
        if (lVar8 == 0) {
LAB_00101fb7:
          bVar12 = false;
        }
        else {
          *pcVar4 = L'?';
          pcVar4 = pcVar4 + 1;
        }
        break;
      }
      cVar5 = L'\0';
LAB_00101f2d:
      if (uVar6 == 0xdc00) {
LAB_00101f65:
        bVar11 = cVar5 == L'\0';
        cVar9 = (char32_t)in_R9;
        if (bVar11) {
          cVar9 = cVar10;
        }
      }
      else if (uVar6 == 0xd800) {
        if ((cVar5 & 0xfc00U) != 0xdc00) goto LAB_00101f65;
        bVar11 = true;
        cVar9 = (uint)(ushort)cVar5 + cVar10 * 0x400 + L'\xfca02400';
      }
      else {
        bVar11 = true;
        cVar9 = (uint)(ushort)cVar2;
      }
      if (lVar8 == 0) goto LAB_00101fb7;
      if (!bVar11) {
        cVar9 = L'?';
      }
      in_R9 = (ulong)(uint)cVar9;
      *pcVar4 = cVar9;
      pcVar7 = pcVar7 + 1;
      lVar8 = lVar8 + -4;
      pcVar4 = pcVar4 + 1;
    } while (pcVar7 != pcVar1);
  }
  *pcVar4 = L'\0';
  UTF_test(line,bVar12);
  cVar10 = *local_460._M_dataplus._M_p;
  if (cVar10 == L'\0') {
    pcVar4 = local_438;
  }
  else {
    pcVar4 = local_438;
    lVar8 = 0;
    while (*pcVar4 != L'\0') {
      bVar12 = local_460._M_string_length + 1 == lVar8;
      if ((cVar10 != *pcVar4) || (local_460._M_string_length + 1 == lVar8)) goto LAB_00102019;
      pcVar4 = pcVar4 + 1;
      cVar10 = local_460._M_dataplus._M_p[lVar8 + 1];
      lVar8 = lVar8 + 1;
      if (cVar10 == L'\0') break;
    }
  }
  bVar12 = cVar10 == *pcVar4;
LAB_00102019:
  UTF_test(line,bVar12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p);
  }
  return;
}

Assistant:

void us16_to_us32_test(int line, const UTF_US16& str1, const UTF_US32& str2, bool ok)
{
    UTF_US32 tmp;
    UTF_UC32 buf[256];
    UTF_test(line, UTF_u_to_U<'?'>(str1, tmp) == ok);
    UTF_test(line, tmp == str2);
    UTF_test(line, UTF_uj16_to_uj32(str1.c_str(), str1.size(), buf, 256) == UTF_SUCCESS);
    UTF_test(line, UTF_uj32_cmpn(tmp.c_str(), buf, UTF_SIZE_T(tmp.size() + 1)) == 0);
}